

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  LRUHandle **ppLVar6;
  Mutex *__mutex;
  
  uVar3 = Hash(key->data_,key->size_,0);
  uVar4 = uVar3 >> 0x1c;
  __mutex = &this->shard_[uVar4].mutex_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    ppLVar6 = HandleTable::FindPointer(&this->shard_[uVar4].table_,key,uVar3);
    pLVar1 = *ppLVar6;
    if (pLVar1 != (LRUHandle *)0x0) {
      uVar3 = pLVar1->refs;
      if ((uVar3 == 1) && (pLVar1->in_cache == true)) {
        pLVar2 = pLVar1->next;
        pLVar2->prev = pLVar1->prev;
        pLVar1->prev->next = pLVar2;
        pLVar1->next = &this->shard_[uVar4].in_use_;
        pLVar2 = this->shard_[uVar4].in_use_.prev;
        pLVar1->prev = pLVar2;
        pLVar2->next = pLVar1;
        pLVar1->next->prev = pLVar1;
      }
      pLVar1->refs = uVar3 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (Handle *)pLVar1;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

Handle* Lookup(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Lookup(key, hash);
  }